

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

float direction_magnitude(vw *all)

{
  float fVar1;
  
  if ((all->weights).sparse == true) {
    fVar1 = direction_magnitude<sparse_parameters>(all,&(all->weights).sparse_weights);
    return fVar1;
  }
  fVar1 = direction_magnitude<dense_parameters>(all,&(all->weights).dense_weights);
  return fVar1;
}

Assistant:

float direction_magnitude(vw& all)
{
  // compute direction magnitude
  if (all.weights.sparse)
    return direction_magnitude(all, all.weights.sparse_weights);
  else
    return direction_magnitude(all, all.weights.dense_weights);
}